

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DTDScanner::scanDefaultDecl(DTDScanner *this,DTDAttDef *toFill)

{
  short *psVar1;
  XMLBufferMgr *this_00;
  XMLCh *__src;
  MemoryManager *pMVar2;
  bool bVar3;
  int iVar4;
  XMLBuffer *toFill_00;
  undefined4 extraout_var;
  XMLCh *__dest;
  DefAttTypes DVar5;
  size_t __n;
  XMLBufBid bbValue;
  undefined4 extraout_var_00;
  
  bVar3 = XMLReader::skippedString(this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgRequiredString);
  if (bVar3) {
    (toFill->super_XMLAttDef).fDefaultType = Required;
  }
  else {
    bVar3 = XMLReader::skippedString(this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgImpliedString);
    if (bVar3) {
      (toFill->super_XMLAttDef).fDefaultType = Implied;
    }
    else {
      bVar3 = XMLReader::skippedString(this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgFixedString);
      DVar5 = DefAttTypes_Min;
      if (bVar3) {
        bVar3 = ReaderMgr::skippedSpace(this->fReaderMgr);
        if (bVar3) {
          ReaderMgr::skipPastSpaces(this->fReaderMgr);
        }
        else {
          XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
        }
        DVar5 = Fixed;
      }
      (toFill->super_XMLAttDef).fDefaultType = DVar5;
      checkForPERef(this,false,true);
      this_00 = this->fBufMgr;
      toFill_00 = XMLBufferMgr::bidOnBuffer(this_00);
      iVar4 = (*(toFill->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(toFill);
      bVar3 = scanAttValue(this,(XMLCh *)CONCAT44(extraout_var,iVar4),toFill_00,
                           (toFill->super_XMLAttDef).fType);
      if (!bVar3) {
        XMLScanner::emitError(this->fScanner,ExpectedDefAttrDecl);
      }
      __src = toFill_00->fBuffer;
      __src[toFill_00->fIndex] = L'\0';
      if ((toFill->super_XMLAttDef).fValue != (XMLCh *)0x0) {
        (*((toFill->super_XMLAttDef).fMemoryManager)->_vptr_MemoryManager[4])();
      }
      if (__src == (XMLCh *)0x0) {
        __dest = (XMLCh *)0x0;
      }
      else {
        pMVar2 = (toFill->super_XMLAttDef).fMemoryManager;
        __n = 0;
        do {
          psVar1 = (short *)((long)__src + __n);
          __n = __n + 2;
        } while (*psVar1 != 0);
        iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,__n);
        __dest = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
        memcpy(__dest,__src,__n);
      }
      (toFill->super_XMLAttDef).fValue = __dest;
      XMLBufferMgr::releaseBuffer(this_00,toFill_00);
    }
  }
  return;
}

Assistant:

void DTDScanner::scanDefaultDecl(DTDAttDef& toFill)
{
    if (fReaderMgr->skippedString(XMLUni::fgRequiredString))
    {
        toFill.setDefaultType(XMLAttDef::Required);
        return;
    }

    if (fReaderMgr->skippedString(XMLUni::fgImpliedString))
    {
        toFill.setDefaultType(XMLAttDef::Implied);
        return;
    }

    if (fReaderMgr->skippedString(XMLUni::fgFixedString))
    {
        //
        //  There must be space before the fixed value. If there is not, then
        //  emit an error but keep going.
        //
        if (!fReaderMgr->skippedSpace())
            fScanner->emitError(XMLErrs::ExpectedWhitespace);
        else
            fReaderMgr->skipPastSpaces();
        toFill.setDefaultType(XMLAttDef::Fixed);
    }
     else
    {
        toFill.setDefaultType(XMLAttDef::Default);
    }

    //
    //  If we got here, its fixed or default, so we need to get a value.
    //  If we don't, then emit an error but just set the default value to
    //  an empty string and try to keep going.
    //
    // Check for PE ref or optional whitespace
    checkForPERef(false, true);

    XMLBufBid bbValue(fBufMgr);
    if (!scanAttValue(toFill.getFullName(), bbValue.getBuffer(), toFill.getType()))
        fScanner->emitError(XMLErrs::ExpectedDefAttrDecl);

    toFill.setValue(bbValue.getRawBuffer());
}